

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderMultisampleInterpolationTests.cpp
# Opt level: O2

bool deqp::gles31::Functional::anon_unknown_2::verifyGreenImage(Surface *image,TestLog *log)

{
  ostringstream *this;
  uint uVar1;
  uint uVar2;
  int iVar3;
  ConstPixelBufferAccess *pCVar4;
  void *__buf;
  void *__buf_00;
  bool bVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  allocator<char> local_2a2;
  allocator<char> local_2a1;
  string local_2a0;
  string local_280;
  ConstPixelBufferAccess local_260;
  LogImage local_238;
  undefined1 local_1a8 [384];
  
  this = (ostringstream *)(local_1a8 + 8);
  local_1a8._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(this);
  std::operator<<((ostream *)this,"Verifying result image, expecting green.");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this);
  uVar1 = image->m_width;
  iVar6 = 0;
  uVar7 = 0;
  if (0 < (int)uVar1) {
    uVar7 = (ulong)uVar1;
  }
  iVar3 = image->m_height;
  if (image->m_height < 1) {
    iVar3 = 0;
  }
  bVar5 = false;
  for (iVar8 = 0; uVar10 = uVar7, iVar9 = iVar6, iVar8 != iVar3; iVar8 = iVar8 + 1) {
    while (uVar10 != 0) {
      uVar2 = *(uint *)((long)(image->m_pixels).m_ptr + (long)iVar9 * 4);
      bVar5 = (bool)((uVar2 & 0xff00ff) != 0 | bVar5 | (uVar2 & 0xff00) < 0xf700);
      uVar10 = uVar10 - 1;
      iVar9 = iVar9 + 1;
    }
    iVar6 = iVar6 + uVar1;
  }
  if (bVar5) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_280,"ResultImage",&local_2a1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2a0,"Result Image",&local_2a2);
    tcu::Surface::getAccess(&local_260,image);
    pCVar4 = &local_260;
    tcu::LogImage::LogImage(&local_238,&local_280,&local_2a0,pCVar4,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write(&local_238,(int)log,__buf,(size_t)pCVar4);
    local_1a8._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1a8 + 8));
    std::operator<<((ostream *)(local_1a8 + 8),"Image verification failed.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_280,"ResultImage",&local_2a1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2a0,"Result Image",&local_2a2);
    tcu::Surface::getAccess(&local_260,image);
    pCVar4 = &local_260;
    tcu::LogImage::LogImage(&local_238,&local_280,&local_2a0,pCVar4,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write(&local_238,(int)log,__buf_00,(size_t)pCVar4);
    local_1a8._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1a8 + 8));
    std::operator<<((ostream *)(local_1a8 + 8),"Image verification passed.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1a8 + 8));
  tcu::LogImage::~LogImage(&local_238);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::~string((string *)&local_280);
  return (bool)~bVar5;
}

Assistant:

static bool verifyGreenImage (const tcu::Surface& image, tcu::TestLog& log)
{
	bool error = false;

	log << tcu::TestLog::Message << "Verifying result image, expecting green." << tcu::TestLog::EndMessage;

	// all pixels must be green

	for (int y = 0; y < image.getHeight(); ++y)
	for (int x = 0; x < image.getWidth(); ++x)
	{
		const tcu::RGBA color			= image.getPixel(x, y);
		const int		greenThreshold	= 8;

		if (color.getRed() > 0 || color.getGreen() < 255-greenThreshold || color.getBlue() > 0)
			error = true;
	}

	if (error)
		log	<< tcu::TestLog::Image("ResultImage", "Result Image", image.getAccess())
			<< tcu::TestLog::Message
			<< "Image verification failed."
			<< tcu::TestLog::EndMessage;
	else
		log	<< tcu::TestLog::Image("ResultImage", "Result Image", image.getAccess())
			<< tcu::TestLog::Message
			<< "Image verification passed."
			<< tcu::TestLog::EndMessage;

	return !error;
}